

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashMap.hpp
# Opt level: O1

HME * __thiscall
BCL::
HashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
::atomic_get_entry(HME *__return_storage_ptr__,
                  HashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
                  *this,size_type slot)

{
  pointer pGVar1;
  BCL *this_00;
  BCL *this_01;
  size_t sVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  atomic_op<int> *in_R8;
  size_t sVar8;
  GlobalPtr<int> ptr;
  GlobalPtr<const_BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>
  src;
  GlobalPtr<int> ptr_00;
  GlobalPtr<int> ptr_01;
  GlobalPtr<int> ptr_02;
  uint local_4c [7];
  
  lVar4 = lrand48();
  uVar5 = slot / this->local_capacity_;
  pGVar1 = (this->hash_table_).
           super__Vector_base<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>,_std::allocator<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_00 = (BCL *)pGVar1[uVar5].rank;
  uVar7 = 1 << ((char)lVar4 +
                ((char)(SUB168(SEXT816(lVar4) * ZEXT816(0x8888888888888889),8) >> 4) -
                (SUB161(SEXT816(lVar4) * ZEXT816(0x8888888888888889),0xf) >> 7)) * -0x1e + 2U & 0x1f
               );
  sVar8 = pGVar1[uVar5].ptr + (slot % this->local_capacity_) * 0x20 + 0x1c;
  local_4c[1] = 0x10a930;
  local_4c[2] = 0;
  local_4c[3] = 0x10a968;
  local_4c[4] = 0;
  local_4c[5] = 0x10a9a0;
  local_4c[6] = 0;
  ptr.ptr = (size_t)local_4c;
  ptr.rank = sVar8;
  local_4c[0] = uVar7;
  uVar3 = fetch_and_op<int>(this_00,ptr,(int *)(local_4c + 5),in_R8);
  if (((uVar3 & 2) == 0) || ((uVar3 & uVar7) != 0)) {
    if ((uVar3 & 3) == 0) {
      if ((uVar3 & uVar7) == 0) {
        local_4c[0] = ~uVar7;
        local_4c[1] = 0x10ab50;
        local_4c[2] = 0;
        local_4c[3] = 0x10ab88;
        local_4c[4] = 0;
        local_4c[5] = 0x10abc0;
        local_4c[6] = 0;
        ptr_02.ptr = (size_t)local_4c;
        ptr_02.rank = sVar8;
        fetch_and_op<int>(this_00,ptr_02,(int *)(local_4c + 5),in_R8);
      }
      (__return_storage_ptr__->key).len = 0;
      __return_storage_ptr__->val = 0;
      __return_storage_ptr__->used = 0;
      (__return_storage_ptr__->key).ptr.rank = 0;
      (__return_storage_ptr__->key).ptr.ptr = 0;
    }
    else {
      if ((uVar3 & uVar7) == 0) {
        local_4c[0] = ~uVar7;
        local_4c[1] = 0x10ab50;
        local_4c[2] = 0;
        local_4c[3] = 0x10ab88;
        local_4c[4] = 0;
        local_4c[5] = 0x10abc0;
        local_4c[6] = 0;
        ptr_01.ptr = (size_t)local_4c;
        ptr_01.rank = sVar8;
        fetch_and_op<int>(this_00,ptr_01,(int *)(local_4c + 5),in_R8);
      }
      atomic_get_entry(__return_storage_ptr__,this,slot);
    }
  }
  else {
    uVar5 = this->local_capacity_;
    uVar6 = slot / uVar5;
    pGVar1 = (this->hash_table_).
             super__Vector_base<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>,_std::allocator<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    this_01 = (BCL *)pGVar1[uVar6].rank;
    sVar2 = pGVar1[uVar6].ptr;
    (__return_storage_ptr__->key).ptr.rank = 0;
    (__return_storage_ptr__->key).ptr.ptr = 0;
    (__return_storage_ptr__->key).len = 0;
    __return_storage_ptr__->used = 0;
    src.ptr = (size_t)__return_storage_ptr__;
    src.rank = (slot % uVar5) * 0x20 + sVar2;
    read<BCL::HashMapEntry<std::__cxx11::string,int,BCL::serialize<std::__cxx11::string,0ul,void>,BCL::serialize<int,0ul,void>>>
              (this_01,src,
               (HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
                *)0x1,(size_t)in_R8);
    local_4c[0] = ~uVar7;
    local_4c[1] = 0x10ab50;
    local_4c[2] = 0;
    local_4c[3] = 0x10ab88;
    local_4c[4] = 0;
    local_4c[5] = 0x10abc0;
    local_4c[6] = 0;
    ptr_00.ptr = (size_t)local_4c;
    ptr_00.rank = sVar8;
    fetch_and_op<int>(this_00,ptr_00,(int *)(local_4c + 5),in_R8);
  }
  return __return_storage_ptr__;
}

Assistant:

HME atomic_get_entry(size_type slot) {
    int old_value = ready_flag;

    // Bits 2 -> 32 are for readers to mark reserved
    int read_bit = 2 + (lrand48() % 30);

    auto ptr = slot_used_ptr(slot);

    int return_value = BCL::fetch_and_op<int>(ptr, (0x1 << read_bit), BCL::or_<int>{});

    if (return_value & ready_flag && !(return_value & (0x1 << read_bit))) {
      auto entry = get_entry(slot);
      int rv = BCL::fetch_and_op<int>(ptr, ~(0x1 << read_bit), BCL::and_<int>{});
      return entry;
    } else if ((return_value & (0x3)) == 0) {
      if (!(return_value & (0x1 << read_bit))) {
        int rv = BCL::fetch_and_op<int>(ptr, ~(0x1 << read_bit), BCL::and_<int>{});
      }
      return HME{};
    } else {
      // OPTIMIZE: use return value to pick a reader bit "hint"
      //           unclear if this will help, since reader bits
      //           will only ever be flipped for around 4-6us.
      if (!(return_value & (0x1 << read_bit))) {
        int rv = BCL::fetch_and_op<int>(ptr, ~(0x1 << read_bit), BCL::and_<int>{});
      }
      return atomic_get_entry(slot);
    }
  }